

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

UniquePtr<SSL_ECH_KEYS> __thiscall
bssl::anon_unknown_0::MakeTestECHKeys(anon_unknown_0 *this,uint8_t config_id)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  UniquePtr<SSL_ECH_KEYS> keys;
  UniquePtr<uint8_t> free_ech_config;
  uint8_t *ech_config;
  size_t ech_config_len;
  ScopedEVP_HPKE_KEY key;
  
  EVP_HPKE_KEY_zero(&key.ctx_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar1 = EVP_HPKE_KEY_generate(&key.ctx_,kem);
  if (iVar1 != 0) {
    iVar1 = SSL_marshal_ech_config
                      (&ech_config,&ech_config_len,config_id,&key.ctx_,"public.example",0x10);
    if (iVar1 != 0) {
      free_ech_config._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)ech_config;
      keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)SSL_ECH_KEYS_new()
      ;
      if ((tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
          keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0) {
LAB_0015db42:
        *(undefined8 *)this = 0;
      }
      else {
        iVar1 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                 keys._M_t.
                                 super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1,
                                 ech_config,ech_config_len,&key.ctx_);
        if (iVar1 == 0) goto LAB_0015db42;
        *(__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true> *)this =
             keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl;
        keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>)0x0;
      }
      std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&keys);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_ech_config);
      goto LAB_0015db5a;
    }
  }
  *(undefined8 *)this = 0;
LAB_0015db5a:
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable(&key);
  return (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_ECH_KEYS> MakeTestECHKeys(uint8_t config_id = 1) {
  bssl::ScopedEVP_HPKE_KEY key;
  uint8_t *ech_config;
  size_t ech_config_len;
  if (!EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()) ||
      !SSL_marshal_ech_config(&ech_config, &ech_config_len, config_id,
                              key.get(), "public.example", 16)) {
    return nullptr;
  }
  bssl::UniquePtr<uint8_t> free_ech_config(ech_config);

  // Install a non-retry config.
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  if (!keys || !SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1, ech_config,
                                 ech_config_len, key.get())) {
    return nullptr;
  }
  return keys;
}